

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.cpp
# Opt level: O1

size_t qHash(QLatin1StringView key,size_t seed)

{
  int iVar1;
  unsigned_long __n2;
  long lVar2;
  uint64_t uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  array<char16_t,_256UL> buf;
  undefined1 *local_238 [64];
  long local_38;
  
  uVar12 = key.m_size;
  pcVar8 = key.m_data;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = uVar12 * 2;
  if (uVar12 < 5) {
    local_238[0] = &DAT_aaaaaaaaaaaaaaaa;
    if (uVar12 != 0) {
      lVar11 = uVar12 + 1;
      lVar2 = 0;
      do {
        *(ushort *)((long)local_238 + lVar2 * 2) = (ushort)(byte)pcVar8[lVar2];
        lVar11 = lVar11 + -1;
        lVar2 = lVar2 + 1;
      } while (1 < lVar11);
    }
    uVar3 = murmurhash(local_238,uVar3,0);
    goto LAB_0016f0ee;
  }
  uVar10 = 0x736f6d6570736575;
  uVar4 = 0x6c7967656e657261;
  memset(local_238,0xaa,0x200);
  uVar5 = uVar3 ^ 0x7465646279746573;
  uVar9 = uVar3 ^ 0x646f72616e646f6d;
  if (uVar12 < 0x101) {
    uVar13 = 0;
  }
  else {
    uVar6 = 0x100;
    uVar7 = 0;
    do {
      uVar13 = uVar6;
      qt_from_latin1((char16_t *)local_238,pcVar8 + uVar7,0x100);
      lVar2 = 0;
      do {
        uVar10 = uVar10 + uVar9;
        uVar9 = (uVar9 << 0xd | uVar9 >> 0x33) ^ uVar10;
        uVar5 = uVar5 ^ *(ulong *)((long)local_238 + lVar2);
        uVar6 = (uVar5 << 0x10 | uVar5 >> 0x30) ^ uVar4 + uVar5;
        uVar10 = (uVar10 << 0x20 | uVar10 >> 0x20) + uVar6;
        uVar4 = uVar4 + uVar5 + uVar9;
        uVar9 = (uVar9 << 0x11 | uVar9 >> 0x2f) ^ uVar4;
        uVar4 = uVar4 << 0x20 | uVar4 >> 0x20;
        uVar5 = (uVar6 << 0x15 | uVar6 >> 0x2b) ^ uVar10;
        uVar10 = uVar10 ^ *(ulong *)((long)local_238 + lVar2);
        lVar2 = lVar2 + 8;
      } while (lVar2 != 0x200);
      uVar6 = uVar13 + 0x100;
      uVar7 = uVar13;
    } while (uVar13 + 0x100 < uVar12);
  }
  if (3 < uVar12 - uVar13) {
    uVar6 = uVar12 - uVar13 & 0xfffffffffffffffc;
    qt_from_latin1((char16_t *)local_238,pcVar8 + uVar13,uVar6);
    if (uVar6 * 2 != 0) {
      lVar2 = 0;
      do {
        uVar10 = uVar10 + uVar9;
        uVar9 = (uVar9 << 0xd | uVar9 >> 0x33) ^ uVar10;
        uVar5 = uVar5 ^ *(ulong *)((long)local_238 + lVar2);
        uVar7 = (uVar5 << 0x10 | uVar5 >> 0x30) ^ uVar4 + uVar5;
        uVar10 = (uVar10 << 0x20 | uVar10 >> 0x20) + uVar7;
        uVar4 = uVar4 + uVar5 + uVar9;
        uVar9 = (uVar9 << 0x11 | uVar9 >> 0x2f) ^ uVar4;
        uVar4 = uVar4 << 0x20 | uVar4 >> 0x20;
        uVar5 = (uVar7 << 0x15 | uVar7 >> 0x2b) ^ uVar10;
        uVar10 = uVar10 ^ *(ulong *)((long)local_238 + lVar2);
        lVar2 = lVar2 + 8;
      } while (uVar6 * 2 != lVar2);
    }
    uVar13 = uVar13 + uVar6;
  }
  uVar6 = uVar12 - uVar13;
  if (0 < (long)uVar6) {
    lVar2 = uVar6 + 1;
    lVar11 = 0;
    do {
      *(ushort *)((long)local_238 + lVar11 * 2) = (ushort)(byte)pcVar8[lVar11 + uVar13];
      lVar2 = lVar2 + -1;
      lVar11 = lVar11 + 1;
    } while (1 < lVar2);
  }
  uVar12 = uVar12 << 0x39;
  uVar6 = uVar6 & 0x7fffffffffffffff;
  if (uVar6 == 1) {
LAB_0016f059:
    uVar12 = (ulong)local_238[0] & 0xff | uVar12 | ((ulong)local_238[0] >> 8 & 0xff) << 8;
  }
  else {
    if (uVar6 == 2) {
LAB_0016f041:
      uVar12 = ((ulong)local_238[0] >> 0x10 & 0xff) << 0x10 |
               ((ulong)local_238[0] >> 0x18 & 0xff) << 0x18 | uVar12;
      goto LAB_0016f059;
    }
    if (uVar6 == 3) {
      uVar12 = uVar12 | ((ulong)local_238[0] >> 0x20 & 0xff) << 0x20 |
                        ((ulong)local_238[0] >> 0x28 & 0xff) << 0x28;
      goto LAB_0016f041;
    }
  }
  uVar10 = uVar10 + uVar9;
  uVar13 = (uVar9 << 0xd | uVar9 >> 0x33) ^ uVar10;
  uVar5 = uVar5 ^ uVar12;
  uVar9 = (uVar5 << 0x10 | uVar5 >> 0x30) ^ uVar4 + uVar5;
  uVar6 = (uVar10 << 0x20 | uVar10 >> 0x20) + uVar9;
  uVar4 = uVar4 + uVar5 + uVar13;
  uVar10 = (uVar13 << 0x11 | uVar13 >> 0x2f) ^ uVar4;
  uVar5 = (uVar9 << 0x15 | uVar9 >> 0x2b) ^ uVar6;
  uVar6 = uVar6 ^ uVar12;
  uVar12 = (uVar4 << 0x20 | uVar4 >> 0x20) ^ 0xff;
  iVar1 = 1;
  do {
    uVar6 = uVar6 + uVar10;
    uVar9 = (uVar10 << 0xd | uVar10 >> 0x33) ^ uVar6;
    uVar12 = uVar12 + uVar5;
    uVar4 = (uVar5 << 0x10 | uVar5 >> 0x30) ^ uVar12;
    uVar6 = (uVar6 << 0x20 | uVar6 >> 0x20) + uVar4;
    uVar5 = (uVar4 << 0x15 | uVar4 >> 0x2b) ^ uVar6;
    uVar12 = uVar12 + uVar9;
    uVar10 = (uVar9 << 0x11 | uVar9 >> 0x2f) ^ uVar12;
    uVar12 = uVar12 << 0x20 | uVar12 >> 0x20;
    iVar1 = iVar1 + -1;
  } while (iVar1 == 0);
  uVar3 = uVar12 ^ uVar5 ^ uVar10 ^ uVar6;
LAB_0016f0ee:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar3;
}

Assistant:

size_t qHash(QLatin1StringView key, size_t seed) noexcept
{
#ifdef QT_BOOTSTRAPPED
    // the seed is always 0 in bootstrapped mode (no seed generation code),
    // so help the compiler do dead code elimination
    seed = 0;
#endif

    auto data = reinterpret_cast<const uchar *>(key.data());
    size_t size = key.size();

    // Mix in the length as a secondary seed.
    // Multiplied by 2 to match the byte size of the equiavlent UTF-16 string.
    size_t seed2 = size * 2;
    if (seed)
        seed2 = qt_qhash_seed.currentSeed(1);

#if defined(AESHASH)
    if (seed && qCpuHasFeature(AES) && qCpuHasFeature(SSE4_2))
        return aeshash<ByteToWord>(data, size, seed, seed2);
#endif
    return qHashBits_fallback<ByteToWord>(data, size, seed, seed2);
}